

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QSqlIndex * __thiscall QSQLiteDriver::primaryIndex(QSQLiteDriver *this,QString *tablename)

{
  long lVar1;
  ulong uVar2;
  QSqlResult *pQVar3;
  long *in_RSI;
  QSqlIndex *in_RDI;
  long in_FS_OFFSET;
  QSQLiteDriverPrivate *d;
  QSqlQuery q;
  undefined1 *local_40;
  undefined1 local_38 [7];
  undefined1 in_stack_ffffffffffffffcf;
  QString *in_stack_ffffffffffffffd0;
  QSqlQuery *in_stack_ffffffffffffffd8;
  QSQLiteDriverPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSQLiteDriver *)0x119070);
  uVar2 = (**(code **)(*in_RSI + 0x60))();
  if ((uVar2 & 1) == 0) {
    QString::QString((QString *)0x11908e);
    QString::QString((QString *)0x119098);
    QSqlIndex::QSqlIndex(in_RDI,(QString *)&stack0xffffffffffffffe0,(QString *)local_38);
    QString::~QString((QString *)0x1190b5);
    QString::~QString((QString *)0x1190bf);
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QSqlResult *)(**(code **)(*in_RSI + 200))();
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_40,pQVar3);
    QSqlQuery::setForwardOnly(SUB81(&local_40,0));
    QSQLiteDriverPrivate::getTableInfo
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (bool)in_stack_ffffffffffffffcf);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSqlIndex QSQLiteDriver::primaryIndex(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlIndex();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename, true);
}